

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolve::doStop(ParallelSolve *this)

{
  uint uVar1;
  Generator *pGVar2;
  char *fmt;
  Distributor *in_RDI;
  int err;
  Solver *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (1 < *(uint *)(*(long *)&in_RDI[6].policy_ + 0x134)) {
    SharedContext::master((SharedContext *)0x21cd57);
    reportProgress((ParallelSolve *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8,(char *)0x21cd6b);
    pGVar2 = SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::
             get((SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>
                  *)0x21cd7d);
    if (pGVar2 != (Generator *)0x0) {
      SharedData::setControl(*(SharedData **)&in_RDI[6].policy_,1);
      SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::
      operator->((SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>
                  *)0x21cda8);
      SharedData::Generator::notify
                ((Generator *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 (State)((ulong)in_RDI >> 0x20));
      ParallelHandler::join
                ((ParallelHandler *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    uVar1 = joinThreads(this);
    SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>
                *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (Generator *)in_stack_ffffffffffffffd8);
    SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject>::reset
              ((SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject> *)
               CONCAT44(uVar1,in_stack_fffffffffffffff0),in_RDI);
    if (uVar1 != 0) {
      fmt = Potassco::StringBuilder::c_str
                      ((StringBuilder *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
      Potassco::fail((int)(ulong)uVar1,"virtual void Clasp::mt::ParallelSolve::doStop()",0x197,
                     "err == 0",fmt,0);
    }
  }
  return;
}

Assistant:

void ParallelSolve::doStop() {
	if (shared_->nextId <= 1) { return; }
	reportProgress(*shared_->ctx->master(), "joining with other threads");
	if (shared_->generator.get()) {
		shared_->setControl(SharedData::terminate_flag);
		shared_->generator->notify(SharedData::Generator::done);
		thread_[masterId]->join();
	}
	int err = joinThreads();
	shared_->generator = 0;
	shared_->ctx->distributor.reset(0);
	POTASSCO_CHECK(err == 0, err, shared_->msg.c_str());
}